

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout_p.h
# Opt level: O0

void __thiscall
QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout>::adjustCursor
          (QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout> *this,QPoint *pos)

{
  bool bVar1;
  compare_eq_result_container<QList<int>,_int> cVar2;
  QWidget *this_00;
  QDockWidgetGroupLayout *pQVar3;
  QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout> *in_RSI;
  QDockAreaLayoutInfo *in_RDI;
  long in_FS_OFFSET;
  QWidget *w;
  QList<int> pathToSeparator;
  QPoint *in_stack_ffffffffffffff58;
  QWidget *in_stack_ffffffffffffff60;
  WidgetAttribute attribute;
  QWidget *in_stack_ffffffffffffff68;
  QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout> *path;
  QDockAreaLayoutInfo *this_01;
  QCursor in_stack_ffffffffffffff98;
  QCursor local_60;
  QRect local_58;
  QRect local_48;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  QRect local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  layout((QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout> *)in_RDI);
  this_00 = window((QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout> *)0x604291);
  (in_RDI->separatorWidgets).d.size = (qsizetype)(in_RSI->hoverSeparator).d.d;
  path = in_RSI;
  QPoint::QPoint((QPoint *)in_stack_ffffffffffffff60,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20)
                 ,(int)in_stack_ffffffffffffff58);
  bVar1 = ::operator==((QPoint *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if (bVar1) {
    bVar1 = QList<int>::isEmpty((QList<int> *)0x6042ea);
    if (!bVar1) {
      pQVar3 = layout((QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout> *)in_RDI);
      QDockWidgetGroupLayout::dockAreaLayoutInfo(pQVar3);
      local_20 = QDockAreaLayoutInfo::separatorRect(this_01,&path->hoverSeparator);
      QWidget::update(this_00,(QRect *)in_stack_ffffffffffffff60);
      in_stack_ffffffffffffff68 = this_00;
    }
    QList<int>::clear((QList<int> *)in_stack_ffffffffffffff60);
    if ((*(bool *)((long)&(in_RDI->rect).x2.m_i + 1) & 1U) != 0) {
      *(bool *)((long)&(in_RDI->rect).x2.m_i + 1) = false;
      if ((*(bool *)&(in_RDI->rect).x2.m_i & 1U) == 0) {
        QWidget::unsetCursor(in_stack_ffffffffffffff68);
      }
      else {
        QWidget::setCursor((QWidget *)in_RSI,(QCursor *)in_RDI);
      }
    }
  }
  else {
    bVar1 = QList<int>::isEmpty((QList<int> *)0x604391);
    if (bVar1) {
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      findSeparator((QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout> *)
                    in_stack_ffffffffffffff98.d,(QPoint *)this_01);
      cVar2 = QList<int>::operator!=
                        ((QList<int> *)in_stack_ffffffffffffff60,
                         (QList<int> *)in_stack_ffffffffffffff58);
      if (cVar2) {
        bVar1 = QList<int>::isEmpty((QList<int> *)0x6043f7);
        if (!bVar1) {
          pQVar3 = layout((QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout> *)in_RDI);
          QDockWidgetGroupLayout::dockAreaLayoutInfo(pQVar3);
          local_48 = QDockAreaLayoutInfo::separatorRect(this_01,&path->hoverSeparator);
          QWidget::update(in_stack_ffffffffffffff68,(QRect *)this_00);
          in_stack_ffffffffffffff60 = this_00;
        }
        QList<int>::operator=
                  ((QList<int> *)in_stack_ffffffffffffff60,(QList<int> *)in_stack_ffffffffffffff58);
        bVar1 = QList<int>::isEmpty((QList<int> *)0x604456);
        if (bVar1) {
          if ((*(bool *)((long)&(in_RDI->rect).x2.m_i + 1) & 1U) != 0) {
            *(bool *)((long)&(in_RDI->rect).x2.m_i + 1) = false;
            if ((*(bool *)&(in_RDI->rect).x2.m_i & 1U) == 0) {
              QWidget::unsetCursor(in_stack_ffffffffffffff68);
            }
            else {
              QWidget::setCursor((QWidget *)in_RSI,(QCursor *)in_RDI);
            }
          }
        }
        else {
          pQVar3 = layout((QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout> *)in_RDI);
          QDockWidgetGroupLayout::dockAreaLayoutInfo(pQVar3);
          local_58 = QDockAreaLayoutInfo::separatorRect(this_01,&path->hoverSeparator);
          QWidget::update(in_stack_ffffffffffffff68,(QRect *)in_stack_ffffffffffffff60);
          attribute = (WidgetAttribute)((ulong)in_stack_ffffffffffffff60 >> 0x20);
          if ((*(bool *)((long)&(in_RDI->rect).x2.m_i + 1) & 1U) == 0) {
            QWidget::cursor((QWidget *)in_RSI);
            QCursor::operator=((QCursor *)in_RDI,(QCursor *)in_stack_ffffffffffffff68);
            QCursor::~QCursor(&local_60);
            bVar1 = QWidget::testAttribute(in_stack_ffffffffffffff68,attribute);
            *(bool *)&(in_RDI->rect).x2.m_i = bVar1;
          }
          separatorCursor(in_RSI,(QList<int> *)in_RDI);
          QCursor::operator=((QCursor *)in_RDI,(QCursor *)in_stack_ffffffffffffff68);
          QCursor::~QCursor((QCursor *)&stack0xffffffffffffff98);
          QWidget::setCursor((QWidget *)in_RSI,(QCursor *)in_RDI);
          *(bool *)((long)&(in_RDI->rect).x2.m_i + 1) = true;
        }
      }
      QList<int>::~QList((QList<int> *)0x604586);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMainWindowLayoutSeparatorHelper<Layout>::adjustCursor(const QPoint &pos)
{
    QWidget *w = layout()->window();
    hoverPos = pos;

    if (pos == QPoint(0, 0)) {
        if (!hoverSeparator.isEmpty())
            w->update(layout()->dockAreaLayoutInfo()->separatorRect(hoverSeparator));
        hoverSeparator.clear();

        if (cursorAdjusted) {
            cursorAdjusted = false;
            if (hasOldCursor)
                w->setCursor(oldCursor);
            else
                w->unsetCursor();
        }
    } else if (movingSeparator.isEmpty()) { // Don't change cursor when moving separator
        QList<int> pathToSeparator = findSeparator(pos);

        if (pathToSeparator != hoverSeparator) {
            if (!hoverSeparator.isEmpty())
                w->update(layout()->dockAreaLayoutInfo()->separatorRect(hoverSeparator));

            hoverSeparator = pathToSeparator;

            if (hoverSeparator.isEmpty()) {
                if (cursorAdjusted) {
                    cursorAdjusted = false;
                    if (hasOldCursor)
                        w->setCursor(oldCursor);
                    else
                        w->unsetCursor();
                }
            } else {
                w->update(layout()->dockAreaLayoutInfo()->separatorRect(hoverSeparator));
                if (!cursorAdjusted) {
                    oldCursor = w->cursor();
                    hasOldCursor = w->testAttribute(Qt::WA_SetCursor);
                }
                adjustedCursor = separatorCursor(hoverSeparator);
                w->setCursor(adjustedCursor);
                cursorAdjusted = true;
            }
        }
    }
}